

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap
::TransferTree(InnerMap *this,void **table,size_type index)

{
  Tree *tree;
  size_type b;
  _Base_ptr p_Var1;
  iterator local_40;
  
  tree = (Tree *)table[index];
  p_Var1 = (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    b = Map<std::__cxx11::string,long>::InnerMap::BucketNumber<std::__cxx11::string>
                  ((InnerMap *)this,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (p_Var1 + 1));
    InsertUnique(&local_40,this,b,(Node *)p_Var1[1]._M_parent);
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  } while ((_Rb_tree_header *)p_Var1 != &(tree->_M_t)._M_impl.super__Rb_tree_header);
  DestroyTree(this,tree);
  return;
}

Assistant:

void TransferTree(void* const* table, size_type index) {
      Tree* tree = static_cast<Tree*>(table[index]);
      typename Tree::iterator tree_it = tree->begin();
      do {
        InsertUnique(BucketNumber(std::cref(tree_it->first).get()),
                     NodeFromTreeIterator(tree_it));
      } while (++tree_it != tree->end());
      DestroyTree(tree);
    }